

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_entry_free(mtree_entry_conflict *me)

{
  void *in_RDI;
  
  archive_string_free((archive_string *)0x18c792);
  archive_string_free((archive_string *)0x18c79f);
  archive_string_free((archive_string *)0x18c7ac);
  archive_string_free((archive_string *)0x18c7bc);
  archive_string_free((archive_string *)0x18c7cc);
  archive_string_free((archive_string *)0x18c7dc);
  archive_string_free((archive_string *)0x18c7ec);
  free(*(void **)((long)in_RDI + 0x28));
  free(*(void **)((long)in_RDI + 0x30));
  free(in_RDI);
  return;
}

Assistant:

static void
mtree_entry_free(struct mtree_entry *me)
{
	archive_string_free(&me->parentdir);
	archive_string_free(&me->basename);
	archive_string_free(&me->pathname);
	archive_string_free(&me->symlink);
	archive_string_free(&me->uname);
	archive_string_free(&me->gname);
	archive_string_free(&me->fflags_text);
	free(me->dir_info);
	free(me->reg_info);
	free(me);
}